

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void __thiscall
duckdb::TemplatedValidityMask<unsigned_long>::SetAllInvalid
          (TemplatedValidityMask<unsigned_long> *this,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  unsigned_long uVar3;
  long lVar4;
  
  EnsureWritable(this);
  if (count != 0) {
    uVar2 = count + 0x3f >> 6;
    puVar1 = this->validity_mask;
    for (lVar4 = 0; uVar2 - 1 != lVar4; lVar4 = lVar4 + 1) {
      puVar1[lVar4] = 0;
    }
    uVar3 = -1L << ((byte)count & 0x3f);
    if ((count & 0x3f) == 0) {
      uVar3 = 0;
    }
    this->validity_mask[uVar2 - 1] = uVar3;
  }
  return;
}

Assistant:

inline void SetAllInvalid(idx_t count) {
		EnsureWritable();
		if (count == 0) {
			return;
		}
		auto last_entry_index = ValidityBuffer::EntryCount(count) - 1;
		for (idx_t i = 0; i < last_entry_index; i++) {
			validity_mask[i] = 0;
		}
		auto last_entry_bits = count % BITS_PER_VALUE;
		validity_mask[last_entry_index] =
		    (last_entry_bits == 0) ? 0 : static_cast<V>(ValidityBuffer::MAX_ENTRY << (last_entry_bits));
	}